

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

int Maj_ManAddCnfStart(Maj_Man_t_conflict *p)

{
  sat_solver *s;
  int iVar1;
  Vec_Int_t *p_00;
  int *begin;
  int *end;
  Vec_Int_t *vArray;
  int nLits;
  int m;
  int n;
  int k;
  int j;
  int i;
  int pLits2 [2];
  int pLits [32];
  Maj_Man_t_conflict *p_local;
  
  k = p->nVars + 2;
  do {
    if (p->nObjs <= k) {
      k = 2;
      while( true ) {
        if (p->nObjs + -1 <= k) {
          return 1;
        }
        p_00 = Vec_WecEntry(p->vOutLits,k);
        iVar1 = Vec_IntSize(p_00);
        if (iVar1 < 1) break;
        s = p->pSat;
        begin = Vec_IntArray(p_00);
        end = Vec_IntLimit(p_00);
        iVar1 = sat_solver_addclause(s,begin,end);
        if (iVar1 == 0) {
          return 0;
        }
        k = k + 1;
      }
      __assert_fail("Vec_IntSize(vArray) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                    ,0x194,"int Maj_ManAddCnfStart(Maj_Man_t *)");
    }
    for (m = 0; m < 3; m = m + 1) {
      vArray._0_4_ = 0;
      for (n = 0; n < p->nObjs; n = n + 1) {
        if (p->VarMarks[k][m][n] != 0) {
          iVar1 = Abc_Var2Lit(p->VarMarks[k][m][n],0);
          pLits2[(int)vArray] = iVar1;
          vArray._0_4_ = (int)vArray + 1;
        }
      }
      if ((int)vArray < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj2.c"
                      ,0x177,"int Maj_ManAddCnfStart(Maj_Man_t *)");
      }
      iVar1 = sat_solver_addclause(p->pSat,pLits2,pLits2 + (int)vArray);
      if (iVar1 == 0) {
        return 0;
      }
      for (nLits = 0; vArray._4_4_ = nLits, nLits < (int)vArray; nLits = nLits + 1) {
        while (vArray._4_4_ = vArray._4_4_ + 1, vArray._4_4_ < (int)vArray) {
          j = Abc_LitNot(pLits2[nLits]);
          i = Abc_LitNot(pLits2[vArray._4_4_]);
          iVar1 = sat_solver_addclause(p->pSat,&j,pLits2);
          if (iVar1 == 0) {
            return 0;
          }
        }
      }
      if (((m != 2) && (p->VarMarks[k][m][2] != 0)) && (p->VarMarks[k][m + 1][2] != 0)) {
        for (n = 0; n < p->nObjs; n = n + 1) {
          if (p->VarMarks[k][m][n] != 0) {
            for (nLits = n; nLits < p->nObjs; nLits = nLits + 1) {
              if (p->VarMarks[k][m + 1][nLits] != 0) {
                j = Abc_Var2Lit(p->VarMarks[k][m][n],1);
                i = Abc_Var2Lit(p->VarMarks[k][m + 1][nLits],1);
                iVar1 = sat_solver_addclause(p->pSat,&j,pLits2);
                if (iVar1 == 0) {
                  return 0;
                }
              }
            }
          }
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

int Maj_ManAddCnfStart( Maj_Man_t * p )
{
    int pLits[MAJ_NOBJS], pLits2[2], i, j, k, n, m;
    // input constraints
    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 3; k++ )
        {
            int nLits = 0;
            for ( j = 0; j < p->nObjs; j++ )
                if ( p->VarMarks[i][k][j] )
                    pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k][j], 0 );
            assert( nLits > 0 );
            // input uniqueness
            if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits ) )
                return 0;
            for ( n = 0;   n < nLits; n++ )
            for ( m = n+1; m < nLits; m++ )
            {
                pLits2[0] = Abc_LitNot(pLits[n]);
                pLits2[1] = Abc_LitNot(pLits[m]);
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits2, 2 ) )
                    return 0;
            }
            if ( k == 2 )
                break;
            // symmetry breaking
            for ( j = 0; j < p->nObjs; j++ ) if ( p->VarMarks[i][k][j] )
            for ( n = j; n < p->nObjs; n++ ) if ( p->VarMarks[i][k+1][n] )
            {
                pLits2[0] = Abc_Var2Lit( p->VarMarks[i][k][j], 1 );
                pLits2[1] = Abc_Var2Lit( p->VarMarks[i][k+1][n], 1 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits2, 2 ) )
                    return 0;
            }
        }
    }
    // outputs should be used
    for ( i = 2; i < p->nObjs - 1; i++ )
    {
        Vec_Int_t * vArray = Vec_WecEntry(p->vOutLits, i);
        assert( Vec_IntSize(vArray) > 0 );
        if ( !bmcg_sat_solver_addclause( p->pSat, Vec_IntArray(vArray), Vec_IntSize(vArray) ) )
            return 0;
    }
    return 1;
}